

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_ld_d_mhl_Test::~CpuTest_ld_d_mhl_Test(CpuTest_ld_d_mhl_Test *this)

{
  CpuTest_ld_d_mhl_Test *this_local;
  
  ~CpuTest_ld_d_mhl_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ld_d_mhl) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    regs.h = 0xFF;
    regs.l = 0xEE;

    EXPECT_CALL(mmu, read_byte(0xFFEE)).WillOnce(Return(0xDD));
    execute_instruction(0x56);

    ICpu::Registers expected_regs{};
    expected_regs.d = 0xDD;
    expected_regs.h = 0xFF;
    expected_regs.l = 0xEE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}